

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

BailOutKind __thiscall IR::Instr::GetBailOutKind(Instr *this)

{
  IRKind IVar1;
  code *pcVar2;
  bool bVar3;
  BailOutKind BVar4;
  undefined4 *puVar5;
  
  if ((this->field_0x38 & 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x472,"(this->HasBailOutInfo())","this->HasBailOutInfo()");
    if (!bVar3) goto LAB_004b0da3;
    *puVar5 = 0;
  }
  IVar1 = this->m_kind;
  if (IVar1 == InstrKindProfiled) {
    BVar4 = *(BailOutKind *)&this[1].m_next;
  }
  else if (IVar1 == InstrKindBranch) {
    BVar4 = *(BailOutKind *)&this[1].globOptInstrString;
  }
  else if (IVar1 == InstrKindInstr) {
    BVar4 = *(BailOutKind *)&this[1].m_noLazyHelperAssert;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x47c,"(false)","false");
    if (!bVar3) {
LAB_004b0da3:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    BVar4 = BailOutInvalid;
  }
  return BVar4;
}

Assistant:

BailOutKind
Instr::GetBailOutKind() const
{
    Assert(this->HasBailOutInfo());
    switch (this->m_kind)
    {
    case InstrKindInstr:
        return ((BailOutInstr const *)this)->bailOutKind;
    case InstrKindProfiled:
        return ((ProfiledBailOutInstr const *)this)->bailOutKind;
    case InstrKindBranch:
        return ((BranchBailOutInstr const *)this)->bailOutKind;
    default:
        Assert(false);
        return BailOutInvalid;
    }
}